

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bios.h
# Opt level: O2

int bios_u32(envy_bios *bios,uint offs,uint32_t *res)

{
  uint8_t *puVar1;
  
  if (offs + 3 < bios->length) {
    puVar1 = bios->data;
    *res = CONCAT13(puVar1[offs + 3],
                    CONCAT12(puVar1[offs + 2],CONCAT11(puVar1[offs + 1],puVar1[offs])));
    return 0;
  }
  *res = 0;
  fprintf(_stderr,"requested OOB u32 at 0x%04x\n",(ulong)offs);
  return -0xe;
}

Assistant:

static inline int bios_u32(struct envy_bios *bios, unsigned int offs, uint32_t *res) {
	if (offs+3 >= bios->length) {
		*res = 0;
		ENVY_BIOS_ERR("requested OOB u32 at 0x%04x\n", offs);
		return -EFAULT;
	}
	*res = bios->data[offs] | bios->data[offs+1] << 8 | bios->data[offs+2] << 16 | bios->data[offs+3] << 24;
	return 0;
}